

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::GeneratedMessageReflection::HasBit
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32 has_bit_index;
  CppType CVar2;
  FieldOptions *pFVar3;
  uint32 *has_bit_set;
  Message **ppMVar4;
  ArenaStringPtr *this_00;
  long lVar5;
  bool *pbVar6;
  long *plVar7;
  uint *puVar8;
  unsigned_long *puVar9;
  float *pfVar10;
  double *pdVar11;
  int *piVar12;
  LogMessage *pLVar13;
  bool local_d9;
  LogFinisher local_b1;
  LogMessage local_b0;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  FieldDescriptor *local_28;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  local_28 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  pFVar3 = FieldDescriptor::options(field);
  bVar1 = FieldOptions::weak(pFVar3);
  local_61 = 0;
  if (bVar1) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x7b3);
    local_61 = 1;
    pLVar13 = LogMessage::operator<<(&local_60,"CHECK failed: !field->options().weak(): ");
    LogFinisher::operator=(local_75,pLVar13);
  }
  if ((local_61 & 1) != 0) {
    LogMessage::~LogMessage(&local_60);
  }
  bVar1 = ReflectionSchema::HasHasbits(&this->schema_);
  if (bVar1) {
    has_bit_set = GetHasBits(this,(Message *)field_local);
    has_bit_index = ReflectionSchema::HasBitIndex(&this->schema_,local_28);
    this_local._7_1_ = anon_unknown_0::IsIndexInHasBitSet(has_bit_set,has_bit_index);
  }
  else {
    CVar2 = FieldDescriptor::cpp_type(local_28);
    if (CVar2 == CPPTYPE_MESSAGE) {
      bVar1 = ReflectionSchema::IsDefaultInstance(&this->schema_,(Message *)field_local);
      local_d9 = false;
      if (!bVar1) {
        ppMVar4 = GetRaw<google::protobuf::Message_const*>(this,(Message *)field_local,local_28);
        local_d9 = *ppMVar4 != (Message *)0x0;
      }
      this_local._7_1_ = local_d9;
    }
    else {
      CVar2 = FieldDescriptor::cpp_type(local_28);
      switch(CVar2) {
      case CPPTYPE_INT32:
        piVar12 = GetRaw<int>(this,(Message *)field_local,local_28);
        this_local._7_1_ = *piVar12 != 0;
        break;
      case CPPTYPE_INT64:
        plVar7 = GetRaw<long>(this,(Message *)field_local,local_28);
        this_local._7_1_ = *plVar7 != 0;
        break;
      case CPPTYPE_UINT32:
        puVar8 = GetRaw<unsigned_int>(this,(Message *)field_local,local_28);
        this_local._7_1_ = *puVar8 != 0;
        break;
      case CPPTYPE_UINT64:
        puVar9 = GetRaw<unsigned_long>(this,(Message *)field_local,local_28);
        this_local._7_1_ = *puVar9 != 0;
        break;
      case CPPTYPE_DOUBLE:
        pdVar11 = GetRaw<double>(this,(Message *)field_local,local_28);
        this_local._7_1_ = *pdVar11 != 0.0;
        break;
      case CPPTYPE_FLOAT:
        pfVar10 = GetRaw<float>(this,(Message *)field_local,local_28);
        this_local._7_1_ = *pfVar10 != 0.0;
        break;
      case CPPTYPE_BOOL:
        pbVar6 = GetRaw<bool>(this,(Message *)field_local,local_28);
        this_local._7_1_ = (*pbVar6 & 1U) != 0;
        break;
      case CPPTYPE_ENUM:
        piVar12 = GetRaw<int>(this,(Message *)field_local,local_28);
        this_local._7_1_ = *piVar12 != 0;
        break;
      case CPPTYPE_STRING:
        pFVar3 = FieldDescriptor::options(local_28);
        FieldOptions::ctype(pFVar3);
        this_00 = GetField<google::protobuf::internal::ArenaStringPtr>
                            (this,(Message *)field_local,local_28);
        ArenaStringPtr::Get_abi_cxx11_(this_00);
        lVar5 = std::__cxx11::string::size();
        this_local._7_1_ = lVar5 != 0;
        break;
      case CPPTYPE_MESSAGE:
      default:
        LogMessage::LogMessage
                  (&local_b0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0x7e4);
        pLVar13 = LogMessage::operator<<(&local_b0,"Reached impossible case in HasBit().");
        LogFinisher::operator=(&local_b1,pLVar13);
        LogMessage::~LogMessage(&local_b0);
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool GeneratedMessageReflection::HasBit(
    const Message& message, const FieldDescriptor* field) const {
  GOOGLE_DCHECK(!field->options().weak());
  if (schema_.HasHasbits()) {
    return IsIndexInHasBitSet(GetHasBits(message), schema_.HasBitIndex(field));
  }

  // proto3: no has-bits. All fields present except messages, which are
  // present only if their message-field pointer is non-NULL.
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    return !schema_.IsDefaultInstance(message) &&
        GetRaw<const Message*>(message, field) != NULL;
  } else {
    // Non-message field (and non-oneof, since that was handled in HasField()
    // before calling us), and singular (again, checked in HasField). So, this
    // field must be a scalar.

    // Scalar primitive (numeric or string/bytes) fields are present if
    // their value is non-zero (numeric) or non-empty (string/bytes).  N.B.:
    // we must use this definition here, rather than the "scalar fields
    // always present" in the proto3 docs, because MergeFrom() semantics
    // require presence as "present on wire", and reflection-based merge
    // (which uses HasField()) needs to be consistent with this.
    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default: {
            return GetField<ArenaStringPtr>(message, field).Get().size() > 0;
          }
        }
        return false;
      case FieldDescriptor::CPPTYPE_BOOL:
        return GetRaw<bool>(message, field) != false;
      case FieldDescriptor::CPPTYPE_INT32:
        return GetRaw<int32>(message, field) != 0;
      case FieldDescriptor::CPPTYPE_INT64:
        return GetRaw<int64>(message, field) != 0;
      case FieldDescriptor::CPPTYPE_UINT32:
        return GetRaw<uint32>(message, field) != 0;
      case FieldDescriptor::CPPTYPE_UINT64:
        return GetRaw<uint64>(message, field) != 0;
      case FieldDescriptor::CPPTYPE_FLOAT:
        return GetRaw<float>(message, field) != 0.0;
      case FieldDescriptor::CPPTYPE_DOUBLE:
        return GetRaw<double>(message, field) != 0.0;
      case FieldDescriptor::CPPTYPE_ENUM:
        return GetRaw<int>(message, field) != 0;
      case FieldDescriptor::CPPTYPE_MESSAGE:
        // handled above; avoid warning
        break;
    }
    GOOGLE_LOG(FATAL) << "Reached impossible case in HasBit().";
    return false;
  }
}